

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::LowerNewScObject
          (Lowerer *this,Instr *newObjInstr,bool callCtor,bool hasArgs,
          bool isBaseClassConstructorNewScObject)

{
  Func *pFVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  ExecutionMode EVar5;
  ArgSlot AVar6;
  undefined4 *puVar7;
  LabelInstr *pLVar8;
  undefined7 extraout_var;
  Lowerer *pLVar9;
  FixedFieldInfo *this_00;
  intptr_t iVar10;
  Lowerer *pLVar11;
  intptr_t iVar12;
  Opnd *opndArg;
  HelperCallOpnd *pHVar13;
  RegOpnd *opnd;
  IntConstOpnd *callInfo;
  Instr *pIVar14;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  byte bVar15;
  uint lineNumber;
  char *this_01;
  undefined7 in_register_00000081;
  uint uVar16;
  byte bVar17;
  LowererMD *pLVar18;
  Lowerer *src;
  char cVar19;
  JnHelperMethod JVar20;
  bool bVar21;
  Instr *local_b8;
  Instr *startCallInstr;
  bool local_9f;
  Instr *local_98;
  LabelInstr *local_90;
  ulong local_88;
  Func *local_80;
  RegOpnd *local_78;
  LowererMD *local_70;
  Lowerer *local_68;
  Instr *local_60;
  Lowerer *local_58;
  uint local_4c;
  byte local_46;
  byte local_45;
  JnHelperMethod local_44;
  Lowerer *local_40;
  bool local_35;
  bool local_34;
  bool local_33;
  byte local_32;
  byte local_31;
  bool skipNewScObj;
  bool returnNewScObj;
  bool emitBailOut;
  
  local_44 = (JnHelperMethod)CONCAT71(in_register_00000009,hasArgs);
  local_60 = (Instr *)CONCAT44(local_60._4_4_,(int)CONCAT71(in_register_00000011,callCtor));
  if ((newObjInstr->m_kind == InstrKindJitProfiling) &&
     ((newObjInstr[1].m_noLazyHelperAssert & 4U) != 0)) {
    if (callCtor) {
LAB_0059d789:
      pIVar14 = LowerProfiledNewArray(this,(JitProfilingInstr *)newObjInstr,false);
      return pIVar14;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar21 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                        ,0x117d,"(callCtor)","callCtor");
    if (bVar21) {
      *puVar7 = 0;
      if (newObjInstr->m_kind != InstrKindJitProfiling) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar21 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                            ,199,"(this->IsJitProfilingInstr())","Bad call to AsProfiledInstr()");
        if (!bVar21) goto LAB_0059e20f;
        *puVar7 = 0;
      }
      goto LAB_0059d789;
    }
    goto LAB_0059e20f;
  }
  local_88 = CONCAT44(local_88._4_4_,
                      (int)CONCAT71(in_register_00000081,isBaseClassConstructorNewScObject));
  local_4c = (uint)newObjInstr->m_opcode;
  bVar21 = local_4c == 0xc9;
  local_46 = newObjInstr->m_opcode == NewScObjectSpread;
  local_80 = newObjInstr->m_func;
  local_98 = InsertLoweredRegionStartMarker(this,newObjInstr);
  local_58 = (Lowerer *)newObjInstr->m_dst;
  local_78 = (RegOpnd *)newObjInstr->m_src1;
  OVar3 = IR::Opnd::GetKind((Opnd *)local_58);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_0059e20f;
    *puVar7 = 0;
  }
  bVar17 = (byte)local_60 & (undefined1)local_44;
  local_45 = bVar21;
  if ((bVar17 == 1) && (newObjInstr->m_src2 == (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar21 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                        ,0x118e,"(!callCtor || !hasArgs || (newObjInstr->GetSrc2() != nullptr ))",
                        "!callCtor || !hasArgs || (newObjInstr->GetSrc2() != nullptr )");
    if (!bVar21) goto LAB_0059e20f;
    *puVar7 = 0;
  }
  local_35 = false;
  local_34 = false;
  local_33 = false;
  local_68 = local_58;
  local_40 = this;
  if ((byte)local_60 != '\0') {
    local_68 = (Lowerer *)IR::RegOpnd::New(TyVar,local_80);
  }
  pFVar1 = local_80;
  pLVar8 = IR::LabelInstr::New(Label,local_80,true);
  local_90 = IR::LabelInstr::New(Label,pFVar1,false);
  local_70 = (LowererMD *)pLVar8;
  local_31 = TryLowerNewScObjectWithFixedCtorCache
                       (local_40,newObjInstr,(RegOpnd *)local_68,pLVar8,local_90,&local_35,&local_34
                        ,&local_33);
  local_32 = local_35;
  bVar15 = local_35 ^ 1;
  if (bVar15 == 0 && (byte)local_60 == '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar21 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                        ,0x119c,"(!skipNewScObj || callCtor)",
                        "What will we return if we skip the default new object and don\'t call the ctor?"
                       );
    if (!bVar21) goto LAB_0059e20f;
    *puVar7 = 0;
  }
  if (local_32 == 0) {
    pLVar11 = local_40;
    uVar16 = local_4c;
    if (local_31 != 0) goto LAB_0059d531;
  }
  else {
    if (local_34 == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar21 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                          ,0x119d,"(!skipNewScObj || !returnNewScObj)",
                          "!skipNewScObj || !returnNewScObj");
      if (!bVar21) goto LAB_0059e20f;
      *puVar7 = 0;
    }
    if (local_31 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar21 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                          ,0x119e,"(usedFixedCtorCache || !skipNewScObj)",
                          "usedFixedCtorCache || !skipNewScObj");
      if (!bVar21) goto LAB_0059e20f;
      *puVar7 = 0;
      pLVar11 = local_40;
      uVar16 = local_4c;
    }
    else {
LAB_0059d531:
      pLVar11 = local_40;
      uVar16 = local_4c;
      bVar21 = IR::Instr::HasFixedFunctionAddressTarget(newObjInstr);
      if (!bVar21) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar21 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                            ,0x119f,
                            "(!usedFixedCtorCache || newObjInstr->HasFixedFunctionAddressTarget())",
                            "!usedFixedCtorCache || newObjInstr->HasFixedFunctionAddressTarget()");
        if (!bVar21) goto LAB_0059e20f;
        *puVar7 = 0;
        pLVar11 = local_40;
        uVar16 = local_4c;
      }
      if (local_32 == 0) goto LAB_0059d605;
    }
    if (local_33 == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar21 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                          ,0x11a0,"(!skipNewScObj || !emitBailOut)","!skipNewScObj || !emitBailOut")
      ;
      if (!bVar21) goto LAB_0059e20f;
      *puVar7 = 0;
      pLVar11 = local_40;
      uVar16 = local_4c;
    }
  }
LAB_0059d605:
  local_b8 = (Instr *)0x0;
  if (bVar17 != 0) {
    bVar21 = IR::Instr::HasEmptyArgOutChain(newObjInstr,&local_b8);
    local_44 = (JnHelperMethod)CONCAT71(extraout_var,bVar21) ^ HelperScrFunc_OP_NewScFunc;
  }
  if (local_32 == 0) {
    if (local_31 != 0) {
      IR::Instr::InsertBefore(newObjInstr,(Instr *)local_70);
    }
    if (local_33 == true) {
      pLVar9 = (Lowerer *)IR::Instr::New(newObjInstr->m_opcode,local_80);
      IR::Instr::TransferTo(newObjInstr,(Instr *)pLVar9);
      newObjInstr->m_opcode = BailOut;
      IR::Instr::InsertAfter(newObjInstr,(Instr *)pLVar9);
      local_70 = (LowererMD *)0x0;
      GenerateBailOut(pLVar11,newObjInstr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
      bVar17 = local_31 | (undefined1)local_44;
      local_88 = 0;
      newObjInstr = (Instr *)pLVar9;
    }
    else {
      if ((*(byte *)((long)&(local_58->m_lowererMD).FloatPrefThreshold + 3) & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar21 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                            ,0x11ca,"(!newObjDst->CanStoreTemp())","!newObjDst->CanStoreTemp()");
        if (!bVar21) goto LAB_0059e20f;
        *puVar7 = 0;
      }
      LoadScriptContext(pLVar11,newObjInstr);
      if ((byte)local_60 == '\0') {
        JVar20 = (uint)((undefined1)local_44 ^ 1) + (uint)((undefined1)local_44 ^ 1) * 2 +
                 HelperNewScObjectNoCtor;
        if ((char)local_88 != '\0') {
          JVar20 = local_44 & HelperOp_ScopedGetMethod ^ HelperNewScObjectNoArgNoCtorFull;
        }
        if (local_90 == (LabelInstr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar21 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                              ,0x11e1,"(callCtorLabel != nullptr)","callCtorLabel != nullptr");
          if (!bVar21) goto LAB_0059e20f;
          *puVar7 = 0;
        }
        IR::Instr::InsertAfter(newObjInstr,&local_90->super_Instr);
        this_01 = (char *)&pLVar11->m_lowererMD;
        opndArg = IR::Instr::UnlinkSrc1(newObjInstr);
        LowererMD::LoadHelperArgument((LowererMD *)this_01,newObjInstr,opndArg);
        LowererMD::ChangeToHelperCall
                  ((LowererMD *)this_01,newObjInstr,JVar20,(LabelInstr *)0x0,(Opnd *)0x0,
                   (PropertySymOpnd *)0x0,false);
        if (local_68 != local_58) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          this_01 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
          ;
          bVar21 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                              ,0x11e9,"(createObjDst == newObjDst)","createObjDst == newObjDst");
          if (!bVar21) goto LAB_0059e20f;
          *puVar7 = 0;
        }
        pIVar14 = RemoveLoweredRegionStartMarker((Lowerer *)this_01,local_98);
        return pIVar14;
      }
      bVar17 = local_31 | (undefined1)local_44;
      local_70 = &local_40->m_lowererMD;
      LowererMD::LoadHelperArgument(local_70,newObjInstr,newObjInstr->m_src1);
      pLVar11 = local_40;
      pFVar1 = local_80;
      pHVar13 = IR::HelperCallOpnd::New(bVar17 + HelperNewScObjectNoArg,local_80);
      pLVar8 = (LabelInstr *)IR::Instr::New(Call,(Opnd *)local_68,&pHVar13->super_Opnd,pFVar1);
      IR::Instr::InsertBefore(newObjInstr,(Instr *)pLVar8);
      uVar16 = local_4c;
      pLVar18 = local_70;
      local_70 = (LowererMD *)pLVar8;
      LowererMD::LowerCall(pLVar18,(Instr *)pLVar8,0);
      local_88 = (ulong)(bVar17 ^ 1);
    }
    bVar17 = bVar17 & (byte)local_60;
LAB_0059d909:
    IR::Instr::InsertBefore(newObjInstr,&local_90->super_Instr);
    pLVar9 = (Lowerer *)newObjInstr;
    if ((local_31 & bVar17) == 1) {
      this_00 = IR::Instr::GetFixedFunction(newObjInstr);
      iVar10 = FixedFieldInfo::GetFuncInfoAddr(this_00);
      pLVar18 = local_70;
      pLVar11 = local_40;
      if (((undefined1)local_44 != '\0') ||
         ((iVar12 = ThreadContextInfo::GetJavascriptObjectNewInstanceAddr
                              (local_40->m_func->m_threadContextInfo), iVar10 != iVar12 &&
          (iVar12 = ThreadContextInfo::GetJavascriptArrayNewInstanceAddr
                              (local_40->m_func->m_threadContextInfo), pLVar11 = local_40,
          iVar10 != iVar12)))) {
LAB_0059d973:
        local_9f = true;
        startCallInstr = (Instr *)0x0;
        pLVar9 = (Lowerer *)&pLVar11->m_lowererMD;
        local_60 = LowererMD::LoadNewScObjFirstArg
                             ((LowererMD *)pLVar9,newObjInstr,(Opnd *)local_68,
                              (ushort)(local_46 | local_45));
        pFVar1 = (((Lowerer *)newObjInstr)->m_lowererMD).m_func;
        if (local_32 == 0) {
          pLVar11 = (Lowerer *)IR::RegOpnd::New(TyVar,local_80);
          IR::Instr::UnlinkDst(newObjInstr);
          IR::Instr::SetDst(newObjInstr,(Opnd *)pLVar11);
          if ((uVar16 == 0x160) || (uVar16 == 0xc9)) {
            LowerSpreadCall(local_40,newObjInstr,CallFlags_New,false);
          }
          else {
            LowererMD::LowerCallI((LowererMD *)pLVar9,newObjInstr,1,false,local_60);
          }
          src = local_68;
          if (local_34 == false) {
            LowerGetNewScObjectCommon
                      (local_40,(RegOpnd *)pLVar11,(RegOpnd *)pLVar11,(RegOpnd *)local_68,
                       (Instr *)pFVar1);
            src = pLVar11;
          }
          pLVar9 = local_58;
          InsertMove((Opnd *)local_58,(Opnd *)src,(Instr *)pFVar1,true);
        }
        else {
          if ((Lowerer *)(((Lowerer *)newObjInstr)->m_lowererMD).lowererMDArch.helperCallArgs[1] !=
              local_58) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar7 = 1;
            bVar21 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                ,0x1228,"(newObjInstr->GetDst() == newObjDst)",
                                "newObjInstr->GetDst() == newObjDst");
            if (!bVar21) goto LAB_0059e20f;
            *puVar7 = 0;
          }
          if ((uVar16 == 0x160) || (uVar16 == 0xc9)) {
            pLVar9 = local_40;
            LowerSpreadCall(local_40,newObjInstr,CallFlags_New,false);
          }
          else {
            LowererMD::LowerCallI((LowererMD *)pLVar9,newObjInstr,1,false,local_60);
          }
        }
        if (local_31 == 0) {
          pLVar9 = local_40;
          LowerUpdateNewScObjectCache
                    (local_40,(Instr *)pFVar1,(Opnd *)local_58,&local_78->super_Opnd,false);
        }
        goto LAB_0059e1df;
      }
      pLVar11 = local_40;
      iVar12 = ThreadContextInfo::GetJavascriptObjectNewInstanceAddr
                         (local_40->m_func->m_threadContextInfo);
      if (iVar10 == iVar12) {
        JVar20 = HelperNewJavascriptObjectNoArg;
        if (local_32 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          lineNumber = 0x1205;
LAB_0059dd57:
          bVar21 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                              ,lineNumber,"(skipNewScObj)","skipNewScObj");
          if (!bVar21) goto LAB_0059e20f;
          *puVar7 = 0;
        }
      }
      else {
        iVar12 = ThreadContextInfo::GetJavascriptArrayNewInstanceAddr
                           (pLVar11->m_func->m_threadContextInfo);
        pLVar11 = local_40;
        if (iVar10 != iVar12) goto LAB_0059d973;
        JVar20 = HelperNewJavascriptArrayNoArg;
        if (local_32 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          lineNumber = 0x120b;
          goto LAB_0059dd57;
        }
      }
      pLVar11 = local_40;
      LoadScriptContext(local_40,newObjInstr);
      pFVar1 = local_80;
      pHVar13 = IR::HelperCallOpnd::New(JVar20,local_80);
      pIVar14 = IR::Instr::New(Call,(Opnd *)local_58,&pHVar13->super_Opnd,pFVar1);
      IR::Instr::InsertBefore(newObjInstr,pIVar14);
      LowererMD::LowerCall(&pLVar11->m_lowererMD,pIVar14,0);
      cVar19 = (char)local_88;
    }
    else {
      if (bVar17 != 0) goto LAB_0059d973;
      cVar19 = (char)local_88;
      pLVar18 = local_70;
    }
  }
  else {
    bVar17 = (local_31 | (undefined1)local_44) & (byte)local_60;
    if (bVar15 != 0 || bVar17 != 0) {
      local_88 = 0;
      local_70 = (LowererMD *)0x0;
      goto LAB_0059d909;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar21 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                        ,0x11f5,"(!skipNewScObj || callCtor)",
                        "What will we return if we skip the default new object and don\'t call the ctor?"
                       );
    if (!bVar21) goto LAB_0059e20f;
    *puVar7 = 0;
    IR::Instr::InsertBefore(newObjInstr,&local_90->super_Instr);
    pLVar18 = (LowererMD *)0x0;
    cVar19 = '\0';
    pLVar9 = (Lowerer *)newObjInstr;
  }
  local_9f = true;
  startCallInstr = (Instr *)0x0;
  if (*(char *)((long)(pLVar9->m_lowererMD).lowererMDArch.helperCallArgs + 1) == '\n') {
    EVar5 = JITTimeWorkItem::GetJitMode(local_40->m_func->m_workItem);
    if (EVar5 != SimpleJit) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar21 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                          ,0x125b,"(m_func->IsSimpleJit())","m_func->IsSimpleJit()");
      if (!bVar21) goto LAB_0059e20f;
      *puVar7 = 0;
    }
    if (DAT_015a4e4c == '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar21 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                          ,0x125c,"(!(Js::Configuration::Global.flags.NewSimpleJit))",
                          "!CONFIG_FLAG(NewSimpleJit)");
      if (!bVar21) goto LAB_0059e20f;
      *puVar7 = 0;
    }
    opnd = local_78;
    if ((cVar19 != '\0') &&
       (OVar3 = IR::Opnd::GetKind(&local_78->super_Opnd), opnd = local_78, OVar3 == OpndKindReg)) {
      OVar3 = IR::Opnd::GetKind((Opnd *)local_58);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar21 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                            ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar21) goto LAB_0059e20f;
        *puVar7 = 0;
      }
      pFVar1 = (local_58->m_lowererMD).m_func;
      OVar3 = IR::Opnd::GetKind(&local_78->super_Opnd);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar21 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                            ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar21) goto LAB_0059e20f;
        *puVar7 = 0;
      }
      opnd = local_78;
      if (pFVar1 == (Func *)local_78->m_sym) {
        EVar5 = JITTimeWorkItem::GetJitMode
                          (((pLVar9->m_lowererMD).lowererMDArch.m_func)->m_workItem);
        if (EVar5 != SimpleJit) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar21 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                              ,0x1266,"(newObjInstr->m_func->IsSimpleJit())",
                              "newObjInstr->m_func->IsSimpleJit()");
          if (!bVar21) goto LAB_0059e20f;
          *puVar7 = 0;
        }
        if (local_68 == local_58) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar21 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                              ,0x1267,"(createObjDst != newObjDst)","createObjDst != newObjDst");
          if (!bVar21) goto LAB_0059e20f;
          *puVar7 = 0;
        }
        opnd = IR::RegOpnd::New((local_78->super_Opnd).m_type,
                                (pLVar9->m_lowererMD).lowererMDArch.m_func);
        IR::AutoReuseOpnd::Initialize
                  ((AutoReuseOpnd *)&startCallInstr,&opnd->super_Opnd,
                   (pLVar9->m_lowererMD).lowererMDArch.m_func,true);
        InsertMove(&opnd->super_Opnd,&local_78->super_Opnd,(Instr *)pLVar9,true);
      }
    }
    AVar6 = Js::CallInfo::GetArgCountWithoutExtraArgs(CallFlags_New,1);
    callInfo = IR::IntConstOpnd::New((ulong)AVar6 | 0x1000000,TyInt32,local_80,true);
    if (pLVar18 == (LowererMD *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar21 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                          ,0x1273,"(newScObjCall)","newScObjCall");
      if (!bVar21) goto LAB_0059e20f;
      *puVar7 = 0;
    }
    if (*(char *)((long)(pLVar9->m_lowererMD).lowererMDArch.helperCallArgs + 1) != '\n') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar21 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                          ,199,"(this->IsJitProfilingInstr())","Bad call to AsProfiledInstr()");
      if (!bVar21) {
LAB_0059e20f:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    GenerateCallProfiling
              (local_40,*(ProfileId *)((pLVar9->m_lowererMD).lowererMDArch.helperCallArgs + 4),
               *(InlineCacheIndex *)
                ((long)(pLVar9->m_lowererMD).lowererMDArch.helperCallArgs + 0x24),(Opnd *)local_68,
               &opnd->super_Opnd,&callInfo->super_Opnd,false,(Instr *)pLVar18,(Instr *)pLVar9);
  }
  if ((local_68 != local_58) && (local_35 == false)) {
    InsertMove((Opnd *)local_58,(Opnd *)local_68,(Instr *)pLVar9,true);
  }
  IR::Instr::Remove((Instr *)pLVar9);
LAB_0059e1df:
  pIVar14 = RemoveLoweredRegionStartMarker(pLVar9,local_98);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&startCallInstr);
  return pIVar14;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScObject(IR::Instr *newObjInstr, bool callCtor, bool hasArgs, bool isBaseClassConstructorNewScObject)
{
    if (newObjInstr->IsJitProfilingInstr() && newObjInstr->AsJitProfilingInstr()->isNewArray)
    {
        Assert(callCtor);
        return LowerProfiledNewArray(newObjInstr->AsJitProfilingInstr(), hasArgs);
    }

    bool isSpreadCall = newObjInstr->m_opcode == Js::OpCode::NewScObjectSpread ||
        newObjInstr->m_opcode == Js::OpCode::NewScObjArraySpread;

    Func* func = newObjInstr->m_func;

    // Insert a temporary label before the instruction we're about to lower, so that we can return
    // the first instruction above that needs to be lowered after we're done - regardless of argument
    // list, StartCall, etc.
    IR::Instr* startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);

    IR::Opnd *ctorOpnd = newObjInstr->GetSrc1();
    IR::RegOpnd *newObjDst = newObjInstr->GetDst()->AsRegOpnd();

    Assert(!callCtor || !hasArgs || (newObjInstr->GetSrc2() != nullptr /*&& newObjInstr->GetSrc2()->IsSymOpnd()*/));

    bool skipNewScObj = false;
    bool returnNewScObj = false;
    bool emitBailOut = false;
    // If we haven't yet split NewScObject into NewScObjectNoCtor and CallI, we will need a temporary register
    // to hold the result of the object allocation.
    IR::RegOpnd* createObjDst = callCtor ? IR::RegOpnd::New(TyVar, func) : newObjDst;
    IR::LabelInstr* helperOrBailoutLabel = IR::LabelInstr::New(Js::OpCode::Label, func, /* isOpHelper = */ true);
    IR::LabelInstr* callCtorLabel = IR::LabelInstr::New(Js::OpCode::Label, func, /* isOpHelper = */ false);

    // Try to emit the fast allocation and construction path.
    bool usedFixedCtorCache = TryLowerNewScObjectWithFixedCtorCache(newObjInstr, createObjDst, helperOrBailoutLabel, callCtorLabel, skipNewScObj, returnNewScObj, emitBailOut);

    AssertMsg(!skipNewScObj || callCtor, "What will we return if we skip the default new object and don't call the ctor?");
    Assert(!skipNewScObj || !returnNewScObj);
    Assert(usedFixedCtorCache || !skipNewScObj);
    Assert(!usedFixedCtorCache || newObjInstr->HasFixedFunctionAddressTarget());
    Assert(!skipNewScObj || !emitBailOut);

#if DBG && 0 // TODO: OOP JIT, enable assert
    if (usedFixedCtorCache)
    {
        Js::JavascriptFunction* ctor = newObjInstr->GetFixedFunction();
        Js::FunctionInfo* ctorInfo = ctor->GetFunctionInfo();
        Assert((ctorInfo->GetAttributes() & Js::FunctionInfo::Attributes::ErrorOnNew) == 0);
        Assert(!!(ctorInfo->GetAttributes() & Js::FunctionInfo::Attributes::SkipDefaultNewObject) == skipNewScObj);
    }
#endif

    IR::Instr* startCallInstr = nullptr;
    if (callCtor && hasArgs)
    {
        hasArgs = !newObjInstr->HasEmptyArgOutChain(&startCallInstr);
    }

    // If we're not skipping the default new object, let's emit bailout or a call to NewScObject* helper
    IR::JnHelperMethod newScHelper = IR::HelperInvalid;
    IR::Instr *newScObjCall = nullptr;
    if (!skipNewScObj)
    {
        // If we emitted the fast path, this block is a helper block.
        if (usedFixedCtorCache)
        {
            newObjInstr->InsertBefore(helperOrBailoutLabel);
        }

        if (emitBailOut)
        {
            IR::Instr* bailOutInstr = newObjInstr;

            newObjInstr = IR::Instr::New(newObjInstr->m_opcode, func);
            bailOutInstr->TransferTo(newObjInstr);
            bailOutInstr->m_opcode = Js::OpCode::BailOut;
            bailOutInstr->InsertAfter(newObjInstr);

            GenerateBailOut(bailOutInstr);
        }
        else
        {
            Assert(!newObjDst->CanStoreTemp());
            // createObjDst = NewScObject...(ctorOpnd)

            LoadScriptContext(newObjInstr);

            if (callCtor)
            {
                newScHelper = (hasArgs || usedFixedCtorCache ? IR::HelperNewScObjectNoCtor : IR::HelperNewScObjectNoArg);

                m_lowererMD.LoadHelperArgument(newObjInstr, newObjInstr->GetSrc1());

                newScObjCall = IR::Instr::New(Js::OpCode::Call, createObjDst, IR::HelperCallOpnd::New(newScHelper, func), func);
                newObjInstr->InsertBefore(newScObjCall);
                m_lowererMD.LowerCall(newScObjCall, 0);
            }
            else
            {
                newScHelper = 
                    (isBaseClassConstructorNewScObject ?
                        (hasArgs ? IR::HelperNewScObjectNoCtorFull : IR::HelperNewScObjectNoArgNoCtorFull) :
                        (hasArgs ? IR::HelperNewScObjectNoCtor : IR::HelperNewScObjectNoArgNoCtor));

                // Branch around the helper call to execute the inlined ctor.
                Assert(callCtorLabel != nullptr);
                newObjInstr->InsertAfter(callCtorLabel);

                // Change the NewScObject* to a helper call on the spot. This generates implicit call bailout for us if we need one.
                m_lowererMD.LoadHelperArgument(newObjInstr, newObjInstr->UnlinkSrc1());
                m_lowererMD.ChangeToHelperCall(newObjInstr, newScHelper);

                // Then we're done.
                Assert(createObjDst == newObjDst);

                // Return the first instruction above the region we've just lowered.
                return RemoveLoweredRegionStartMarker(startMarkerInstr);                    
            }
        }
    }

    // If we call HelperNewScObjectNoArg directly, we won't be calling the constructor from here, because the helper will do it.
    // We could probably avoid this complexity by converting NewScObjectNoArg to NewScObject in the IRBuilder, once we have dedicated
    // code paths for new Object() and new Array().
    callCtor &= hasArgs || usedFixedCtorCache;
    AssertMsg(!skipNewScObj || callCtor, "What will we return if we skip the default new object and don't call the ctor?");

    newObjInstr->InsertBefore(callCtorLabel);

    if (callCtor && usedFixedCtorCache)
    {
        IR::JnHelperMethod ctorHelper = IR::JnHelperMethodCount;

        // If we have no arguments (i.e. the argument chain is empty), we can recognize a couple of common special cases, such
        // as new Object() or new Array(), for which we have optimized helpers.
        FixedFieldInfo* ctor = newObjInstr->GetFixedFunction();
        intptr_t ctorInfo = ctor->GetFuncInfoAddr();
        if (!hasArgs && (ctorInfo == m_func->GetThreadContextInfo()->GetJavascriptObjectNewInstanceAddr() || ctorInfo == m_func->GetThreadContextInfo()->GetJavascriptArrayNewInstanceAddr()))
        {
            if (ctorInfo == m_func->GetThreadContextInfo()->GetJavascriptObjectNewInstanceAddr())
            {
                Assert(skipNewScObj);
                ctorHelper = IR::HelperNewJavascriptObjectNoArg;
                callCtor = false;
            }
            else if (ctorInfo == m_func->GetThreadContextInfo()->GetJavascriptArrayNewInstanceAddr())
            {
                Assert(skipNewScObj);
                ctorHelper = IR::HelperNewJavascriptArrayNoArg;
                callCtor = false;
            }

            if (!callCtor)
            {
                LoadScriptContext(newObjInstr);

                IR::Instr *ctorCall = IR::Instr::New(Js::OpCode::Call, newObjDst,  IR::HelperCallOpnd::New(ctorHelper, func), func);
                newObjInstr->InsertBefore(ctorCall);
                m_lowererMD.LowerCall(ctorCall, 0);
            }
        }
    }

    IR::AutoReuseOpnd autoReuseSavedCtorOpnd;
    if (callCtor)
    {
        // Load the first argument, which is either the object just created or null. Spread has an extra argument.
        IR::Instr * argInstr = this->m_lowererMD.LoadNewScObjFirstArg(newObjInstr, createObjDst, isSpreadCall ? 1 : 0);

        IR::Instr * insertAfterCtorInstr = newObjInstr->m_next;

        if (skipNewScObj)
        {
            // Since we skipped the default new object, we must be returning whatever the constructor returns
            // (which better be an Object), so let's just use newObjDst directly.
            // newObjDst = newObjInstr->m_src1(createObjDst, ...)
            Assert(newObjInstr->GetDst() == newObjDst);
            if (isSpreadCall)
            {
                newObjInstr = this->LowerSpreadCall(newObjInstr, Js::CallFlags_New);
            }
            else
            {
                newObjInstr = this->m_lowererMD.LowerCallI(newObjInstr, Js::CallFlags_New, false, argInstr);
            }
        }
        else
        {
            // We may need to return the default new object or whatever the constructor returns. Let's stash
            // away the constructor's return in a temporary operand, and do the right check, if necessary.
            // ctorResultObjOpnd = newObjInstr->m_src1(createObjDst, ...)
            IR::RegOpnd *ctorResultObjOpnd = IR::RegOpnd::New(TyVar, func);
            newObjInstr->UnlinkDst();
            newObjInstr->SetDst(ctorResultObjOpnd);

            if (isSpreadCall)
            {
                newObjInstr = this->LowerSpreadCall(newObjInstr, Js::CallFlags_New);
            }
            else
            {
                newObjInstr = this->m_lowererMD.LowerCallI(newObjInstr, Js::CallFlags_New, false, argInstr);
            }

            if (returnNewScObj)
            {
                // MOV newObjDst, createObjDst
                this->InsertMove(newObjDst, createObjDst, insertAfterCtorInstr);
            }
            else
            {
                LowerGetNewScObjectCommon(ctorResultObjOpnd, ctorResultObjOpnd, createObjDst, insertAfterCtorInstr);
                this->InsertMove(newObjDst, ctorResultObjOpnd, insertAfterCtorInstr);
            }
        }

        // We don't ever need to update the constructor cache, if we hard coded it.  Caches requiring update after constructor
        // don't get cloned, and those that don't require update will never need one anymore.
        if (!usedFixedCtorCache)
        {
            LowerUpdateNewScObjectCache(insertAfterCtorInstr, newObjDst, ctorOpnd, false /* isCtorFunction */);
        }
    }
    else
    {
        if (newObjInstr->IsJitProfilingInstr())
        {
            Assert(m_func->IsSimpleJit());
            Assert(!CONFIG_FLAG(NewSimpleJit));

            // This path skipped calling the Ctor, which skips calling LowerCallI with newObjInstr, meaning that the call will not be profiled.
            //   So we insert it manually here.

            if(newScHelper == IR::HelperNewScObjectNoArg &&
                newObjDst &&
                ctorOpnd->IsRegOpnd() &&
                newObjDst->AsRegOpnd()->m_sym == ctorOpnd->AsRegOpnd()->m_sym)
            {
                Assert(newObjInstr->m_func->IsSimpleJit());
                Assert(createObjDst != newObjDst);

                // The function object sym is going to be overwritten, so save it in a temp for profiling
                IR::RegOpnd *const savedCtorOpnd = IR::RegOpnd::New(ctorOpnd->GetType(), newObjInstr->m_func);
                autoReuseSavedCtorOpnd.Initialize(savedCtorOpnd, newObjInstr->m_func);
                Lowerer::InsertMove(savedCtorOpnd, ctorOpnd, newObjInstr);
                ctorOpnd = savedCtorOpnd;
            }

            // It is a constructor (CallFlags_New) and therefore a single argument (this) would have been given.
            const auto info = Lowerer::MakeCallInfoConst(Js::CallFlags_New, 1, func);

            Assert(newScObjCall);
            IR::JitProfilingInstr *const newObjJitProfilingInstr = newObjInstr->AsJitProfilingInstr();
            GenerateCallProfiling(
                newObjJitProfilingInstr->profileId,
                newObjJitProfilingInstr->inlineCacheIndex,
                createObjDst,
                ctorOpnd,
                info,
                false,
                newScObjCall,
                newObjInstr);
        }

        // MOV newObjDst, createObjDst
        if (!skipNewScObj && createObjDst != newObjDst)
        {
            this->InsertMove(newObjDst, createObjDst, newObjInstr);
        }
        newObjInstr->Remove();
    }

    // Return the first instruction above the region we've just lowered.
    return RemoveLoweredRegionStartMarker(startMarkerInstr);
}